

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O2

void __thiscall
jetbrains::teamcity::TeamcityMessages::suiteStarted
          (TeamcityMessages *this,string *name,string *flowId)

{
  string *value;
  RaiiMessage msg;
  RaiiMessage RStack_58;
  string local_50 [32];
  string local_30;
  
  anon_unknown_1::RaiiMessage::RaiiMessage(&RStack_58,"testSuiteStarted",this->m_out);
  std::__cxx11::string::string((string *)&local_30,(string *)name);
  anon_unknown_1::RaiiMessage::writeProperty(&RStack_58,"name",&local_30);
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string(local_50,(string *)flowId);
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty(&RStack_58,(char *)local_50,value);
  std::__cxx11::string::~string(local_50);
  anon_unknown_1::RaiiMessage::~RaiiMessage(&RStack_58);
  return;
}

Assistant:

void TeamcityMessages::suiteStarted(const std::string& name, const std::string& flowId)
{
    RaiiMessage msg("testSuiteStarted", *m_out);
    msg.writeProperty("name", name);
    msg.writePropertyIfNonEmpty("flowId", flowId);
}